

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O2

SN_ELEMENT * __thiscall ON_SerialNumberMap::FirstElement(ON_SerialNumberMap *this)

{
  uint uVar1;
  SN_ELEMENT *pSVar2;
  SN_ELEMENT *pSVar3;
  long lVar4;
  SN_ELEMENT *pSVar5;
  ON__UINT64 OVar6;
  ON_SN_BLOCK *pOVar7;
  
  pSVar5 = (SN_ELEMENT *)0x0;
  OVar6 = 0;
  do {
    if (this->m_snblk_list_count == OVar6) goto LAB_004e9ed1;
    pOVar7 = this->m_snblk_list[OVar6];
    OVar6 = OVar6 + 1;
  } while (pOVar7->m_count <= pOVar7->m_purged);
  lVar4 = (ulong)pOVar7->m_count + 1;
  pSVar3 = (SN_ELEMENT *)&pOVar7[-1].m_sn[0x1fff].m_next;
  do {
    lVar4 = lVar4 + -1;
    if (lVar4 == 0) {
      pSVar5 = (SN_ELEMENT *)0x0;
      break;
    }
    pSVar5 = pSVar3 + 1;
    pSVar2 = pSVar3 + 1;
    pSVar3 = pSVar5;
  } while (pSVar2->m_sn_active == '\0');
LAB_004e9ed1:
  pOVar7 = this->m_sn_block0;
  uVar1 = pOVar7->m_purged;
  if ((uVar1 < pOVar7->m_count) && ((pSVar5 == (SN_ELEMENT *)0x0 || (pOVar7->m_sn0 < pSVar5->m_sn)))
     ) {
    if (uVar1 != 0) {
      if (this->m_bHashTableIsValid != '\0') {
        this->m_bHashTableIsValid = '\0';
      }
      this->m_sn_count = this->m_sn_count - (ulong)uVar1;
      this->m_sn_purged = this->m_sn_purged - (ulong)uVar1;
      ON_SN_BLOCK::CullBlockHelper(pOVar7);
      pOVar7 = this->m_sn_block0;
    }
    if (pOVar7->m_sorted == 0) {
      if (this->m_bHashTableIsValid != '\0') {
        this->m_bHashTableIsValid = '\0';
      }
      ON_SN_BLOCK::SortBlockHelper(pOVar7);
      pOVar7 = this->m_sn_block0;
    }
    if ((pSVar5 == (SN_ELEMENT *)0x0) || (pOVar7->m_sn0 < pSVar5->m_sn)) {
      pSVar5 = pOVar7->m_sn;
    }
  }
  return pSVar5;
}

Assistant:

ON_SerialNumberMap::SN_ELEMENT* ON_SerialNumberMap::FirstElement() const
{
  SN_ELEMENT* e=nullptr;

  // The first element is likely to be m_snblk_list[0]->m_sn[0]
  // so start looking there.
  // The nullptr==e test isn't necessary. It is there to keep
  // the VisualC++ 2022 compiler from crashing.
  for(size_t i = 0; i < m_snblk_list_count && nullptr==e; i++)
  {
    if ( m_snblk_list[i]->m_count > m_snblk_list[i]->m_purged )
    {
      for (size_t j = 0; j < m_snblk_list[i]->m_count; j++ )
      {
        if ( m_snblk_list[i]->m_sn[j].m_sn_active )
        {
          e = &m_snblk_list[i]->m_sn[j];
          break;
        }
      }
      break;
    }
  }

  if ( m_sn_block0.m_count > m_sn_block0.m_purged 
       && (!e || m_sn_block0.m_sn0 < e->m_sn) 
     )
  {
    // It's possible the element is in m_sn_block0.
    if ( m_sn_block0.m_purged > 0 )
    {
      // remove purged elements from m_sn_block0.

      // memory location for specific elements will be changed.
      // This will make the hash table invalid.
      const_cast<ON_SerialNumberMap*>(this)->Internal_HashTableInvalidate();

      const_cast<ON_SerialNumberMap*>(this)->m_sn_count -= m_sn_block0.m_purged;
      const_cast<ON_SerialNumberMap*>(this)->m_sn_purged -= m_sn_block0.m_purged;
      const_cast<ON_SerialNumberMap*>(this)->m_sn_block0.CullBlockHelper();
    }
    if ( !m_sn_block0.m_sorted )
    {
      // sort elements in m_sn_block0.

      // memory location for specific elements will be changed.
      // This will make the hash table invalid.
      const_cast<ON_SerialNumberMap*>(this)->Internal_HashTableInvalidate();

      const_cast<ON_SerialNumberMap*>(this)->m_sn_block0.SortBlockHelper();      
    }
    if ( !e || m_sn_block0.m_sn0 <  e->m_sn )
    {
      // first element in m_sn_block0 is the
      // one with the smallest serial number.
      e = const_cast<struct SN_ELEMENT*>(&m_sn_block0.m_sn[0]);
    }
  }
  return e;
}